

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbols.hpp
# Opt level: O1

void __thiscall cs::token_vargs::~token_vargs(token_vargs *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  void *in_RSI;
  
  pcVar2 = (this->mId)._M_dataplus._M_p;
  paVar1 = &(this->mId).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    in_RSI = (void *)(paVar1->_M_allocated_capacity + 1);
    operator_delete(pcVar2,(ulong)in_RSI);
  }
  token_base::operator_delete(&this->super_token_base,in_RSI);
  return;
}

Assistant:

token_vargs() = delete;